

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetRuntimeMemoryUsage(JsRuntimeHandle runtimeHandle,size_t *memoryUsage)

{
  JsrtRuntime *this;
  ThreadContext *this_00;
  AllocationPolicyManager *this_01;
  size_t sVar1;
  AllocationPolicyManager *allocPolicyManager;
  ThreadContext *threadContext;
  size_t *memoryUsage_local;
  JsRuntimeHandle runtimeHandle_local;
  
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    runtimeHandle_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (memoryUsage == (size_t *)0x0) {
    runtimeHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *memoryUsage = 0;
    this = JsrtRuntime::FromHandle(runtimeHandle);
    this_00 = JsrtRuntime::GetThreadContext(this);
    this_01 = ThreadContext::GetAllocationPolicyManager(this_00);
    sVar1 = AllocationPolicyManager::GetUsage(this_01);
    *memoryUsage = sVar1;
    runtimeHandle_local._4_4_ = JsNoError;
  }
  return runtimeHandle_local._4_4_;
}

Assistant:

CHAKRA_API JsGetRuntimeMemoryUsage(_In_ JsRuntimeHandle runtimeHandle, _Out_ size_t * memoryUsage)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);
    PARAM_NOT_NULL(memoryUsage);
    *memoryUsage = 0;

    ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    AllocationPolicyManager * allocPolicyManager = threadContext->GetAllocationPolicyManager();

    *memoryUsage = allocPolicyManager->GetUsage();

    return JsNoError;
}